

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * compute_U_value(string *__return_storage_ptr__,string *user_password,EncryptionData *data)

{
  unsigned_long uVar1;
  uchar *puVar2;
  uchar *okey;
  EncryptionData *in_RCX;
  size_t n;
  ulong __n;
  uint i;
  long lVar3;
  allocator<char> local_99;
  char udata [32];
  MD5 md5;
  Digest digest;
  string k1;
  
  if (data->R < 3) {
    QPDF::compute_encryption_key(&k1,(QPDF *)user_password,(string *)data,in_RCX);
    std::__cxx11::string::string<std::allocator<char>>((string *)digest,"",(allocator<char> *)&md5);
    __n = CONCAT44(digest._12_4_,digest._8_4_);
    if (0x1f < CONCAT44(digest._12_4_,digest._8_4_)) {
      __n = 0x20;
    }
    memcpy(udata,(void *)CONCAT44(digest._4_4_,digest._0_4_),__n);
    memcpy(udata + __n,padding_string,0x20 - __n);
    std::__cxx11::string::~string((string *)digest);
    digest._0_4_ = data->Length_bytes;
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)digest);
    pad_short_parameter(&k1,uVar1);
    puVar2 = QUtil::unsigned_char_pointer(udata);
    okey = QUtil::unsigned_char_pointer(&k1);
    iterate_rc4(puVar2,0x20,okey,data->Length_bytes,1,false);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,udata,&md5);
  }
  else {
    QPDF::compute_encryption_key(&k1,(QPDF *)user_password,(string *)data,in_RCX);
    MD5::MD5(&md5,(uchar *)user_password,n,(uchar *)in_RCX);
    std::__cxx11::string::string<std::allocator<char>>((string *)digest,"",&local_99);
    pad_or_truncate_password_V4((string *)udata,(string *)digest);
    MD5::encodeDataIncrementally(&md5,(char *)CONCAT44(udata._4_4_,udata._0_4_),0x20);
    std::__cxx11::string::~string((string *)udata);
    std::__cxx11::string::~string((string *)digest);
    MD5::encodeDataIncrementally(&md5,(data->id1)._M_dataplus._M_p,(data->id1)._M_string_length);
    MD5::digest(&md5,digest);
    udata._0_4_ = data->Length_bytes;
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)udata);
    pad_short_parameter(&k1,uVar1);
    puVar2 = QUtil::unsigned_char_pointer(&k1);
    iterate_rc4(digest,0x10,puVar2,data->Length_bytes,0x14,false);
    udata[0] = digest[0];
    udata[1] = digest[1];
    udata[2] = digest[2];
    udata[3] = digest[3];
    udata[4] = digest[4];
    udata[5] = digest[5];
    udata[6] = digest[6];
    udata[7] = digest[7];
    udata[8] = digest[8];
    udata[9] = digest[9];
    udata[10] = digest[10];
    udata[0xb] = digest[0xb];
    udata[0xc] = digest[0xc];
    udata[0xd] = digest[0xd];
    udata[0xe] = digest[0xe];
    udata[0xf] = digest[0xf];
    for (lVar3 = 0x10; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      udata[lVar3] = (char)(((int)lVar3 * (int)lVar3 & 0xffffU) % 0xff);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,udata,&md5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::string::~string((string *)&k1);
  return __return_storage_ptr__;
}

Assistant:

static std::string
compute_U_value(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getR() >= 3) {
        return compute_U_value_R3(user_password, data);
    }

    return compute_U_value_R2(user_password, data);
}